

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O1

void tcg_gen_mulsu2_i64_arm
               (TCGContext_conflict *tcg_ctx,TCGv_i64 rl,TCGv_i64 rh,TCGv_i64 arg1,TCGv_i64 arg2)

{
  TCGTemp *pTVar1;
  TCGTemp *pTVar2;
  TCGTemp *pTVar3;
  TCGOp *pTVar4;
  uintptr_t o_4;
  TCGv_i64 ret;
  uintptr_t o_3;
  uintptr_t o;
  uintptr_t o_1;
  
  pTVar1 = tcg_temp_new_internal_arm(tcg_ctx,TCG_TYPE_I64,false);
  pTVar2 = tcg_temp_new_internal_arm(tcg_ctx,TCG_TYPE_I64,false);
  pTVar3 = tcg_temp_new_internal_arm(tcg_ctx,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar3 - (long)tcg_ctx);
  pTVar4 = tcg_emit_op_arm(tcg_ctx,INDEX_op_mulu2_i64);
  pTVar4->args[0] = (TCGArg)pTVar1;
  pTVar4->args[1] = (TCGArg)pTVar2;
  pTVar4->args[2] = (TCGArg)(arg1 + (long)&tcg_ctx->pool_cur);
  pTVar4->args[3] = (TCGArg)(arg2 + (long)tcg_ctx);
  tcg_gen_sari_i64_arm(tcg_ctx,ret,arg1,0x3f);
  pTVar4 = tcg_emit_op_arm(tcg_ctx,INDEX_op_and_i64);
  pTVar4->args[0] = (TCGArg)pTVar3;
  pTVar4->args[1] = (TCGArg)pTVar3;
  pTVar4->args[2] = (TCGArg)(arg2 + (long)tcg_ctx);
  tcg_gen_sub_i64(tcg_ctx,rh,(TCGv_i64)((long)pTVar2 - (long)tcg_ctx),ret);
  if ((TCGv_i64)((long)pTVar1 - (long)tcg_ctx) != rl) {
    pTVar4 = tcg_emit_op_arm(tcg_ctx,INDEX_op_mov_i64);
    pTVar4->args[0] = (TCGArg)(rl + (long)tcg_ctx);
    pTVar4->args[1] = (TCGArg)pTVar1;
  }
  tcg_temp_free_internal_arm
            (tcg_ctx,(TCGTemp *)((TCGv_i64)((long)pTVar1 - (long)tcg_ctx) + (long)tcg_ctx));
  tcg_temp_free_internal_arm
            (tcg_ctx,(TCGTemp *)((TCGv_i64)((long)pTVar2 - (long)tcg_ctx) + (long)tcg_ctx));
  tcg_temp_free_internal_arm(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_mulsu2_i64(TCGContext *tcg_ctx, TCGv_i64 rl, TCGv_i64 rh, TCGv_i64 arg1, TCGv_i64 arg2)
{
    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_mulu2_i64(tcg_ctx, t0, t1, arg1, arg2);
    /* Adjust for negative input for the signed arg1.  */
    tcg_gen_sari_i64(tcg_ctx, t2, arg1, 63);
    tcg_gen_and_i64(tcg_ctx, t2, t2, arg2);
    tcg_gen_sub_i64(tcg_ctx, rh, t1, t2);
    tcg_gen_mov_i64(tcg_ctx, rl, t0);
    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
    tcg_temp_free_i64(tcg_ctx, t2);
}